

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

uint __thiscall cmCTestGIT::GetGitVersion(cmCTestGIT *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint v [4];
  char *git_version [3];
  string version;
  OutputLogger version_err;
  OneLineParser version_out;
  
  uVar3 = this->CurrentGitVersion;
  if (uVar3 == 0) {
    git_version[0] = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
    git_version[1] = "--version";
    git_version[2] = (char *)0x0;
    version._M_dataplus._M_p = (pointer)&version.field_2;
    version._M_string_length = 0;
    version.field_2._M_local_buf[0] = '\0';
    OneLineParser::OneLineParser(&version_out,this,"version-out> ",&version);
    cmProcessTools::OutputLogger::OutputLogger
              (&version_err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"version-err> ");
    v[0] = 0;
    v[1] = 0;
    v[2] = 0;
    v[3] = 0;
    bVar1 = cmCTestVC::RunChild((cmCTestVC *)this,git_version,(OutputParser *)&version_out,
                                (OutputParser *)&version_err,(char *)0x0,Auto);
    if (bVar1) {
      iVar2 = __isoc99_sscanf(version._M_dataplus._M_p,"git version %u.%u.%u.%u",v,v + 1,v + 2,v + 3
                             );
      if (2 < iVar2) {
        this->CurrentGitVersion = v[0] * 10000000 + v[1] * 100000 + v[3] + v[2] * 1000;
      }
    }
    cmProcessTools::LineParser::~LineParser(&version_err.super_LineParser);
    cmProcessTools::LineParser::~LineParser(&version_out.super_LineParser);
    std::__cxx11::string::~string((string *)&version);
    uVar3 = this->CurrentGitVersion;
  }
  return uVar3;
}

Assistant:

unsigned int cmCTestGIT::GetGitVersion()
{
  if (!this->CurrentGitVersion) {
    const char* git = this->CommandLineTool.c_str();
    char const* git_version[] = { git, "--version", CM_NULLPTR };
    std::string version;
    OneLineParser version_out(this, "version-out> ", version);
    OutputLogger version_err(this->Log, "version-err> ");
    unsigned int v[4] = { 0, 0, 0, 0 };
    if (this->RunChild(git_version, &version_out, &version_err) &&
        sscanf(version.c_str(), "git version %u.%u.%u.%u", &v[0], &v[1], &v[2],
               &v[3]) >= 3) {
      this->CurrentGitVersion = cmCTestGITVersion(v[0], v[1], v[2], v[3]);
    }
  }
  return this->CurrentGitVersion;
}